

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaTextIO.cpp
# Opt level: O2

void __thiscall NaTextStreamFile::GetVarNameList(NaTextStreamFile *this,int *nVars,char ***sVars)

{
  char **ppcVar1;
  char *pcVar2;
  undefined4 *puVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = (ulong)this->nVar;
  *nVars = this->nVar;
  uVar4 = 0xffffffffffffffff;
  if (-1 < (long)uVar5) {
    uVar4 = uVar5 * 8;
  }
  ppcVar1 = (char **)operator_new__(uVar4);
  *sVars = ppcVar1;
  uVar4 = 0;
  while( true ) {
    if ((long)(int)uVar5 <= (long)uVar4) {
      return;
    }
    pcVar2 = (char *)operator_new__(0xd);
    (*sVars)[uVar4] = pcVar2;
    if (**sVars == (char *)0x0) break;
    ppcVar1 = *sVars + uVar4;
    uVar4 = uVar4 + 1;
    sprintf(*ppcVar1,"%s_%d","VAR",uVar4 & 0xffffffff);
    uVar5 = (ulong)(uint)this->nVar;
  }
  puVar3 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar3 = 4;
  __cxa_throw(puVar3,&NaException::typeinfo,0);
}

Assistant:

void    NaTextStreamFile::GetVarNameList (int& nVars, char**& sVars)
{
    nVars = nVar;

    sVars = new char*[nVars];
    if(NULL == sVars)
        throw(na_bad_alloc);

    int    i;
    for(i = 0; i < nVar; ++i){
        sVars[i] = new char[10 + strlen(NaVAR_NAME)];
        if(NULL == sVars[0])
            throw(na_bad_alloc);
        sprintf(sVars[i], "%s_%d", NaVAR_NAME, i + 1);
    }
}